

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void foreach_source_inner
               (CManager_conflict cm,EVstone to_stone,char *seen,ForeachSourceCB cb,
               source_info *info)

{
  int iVar1;
  int iVar2;
  event_path_data evp;
  CMConnection_conflict p_Var3;
  _proto_action *p_Var4;
  stone_type p_Var5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint stone_num;
  int iVar9;
  long lVar10;
  
  evp = cm->evp;
  if (0 < evp->stone_count) {
    stone_num = evp->stone_base_num;
    do {
      p_Var5 = stone_struct(evp,stone_num);
      if ((p_Var5 != (stone_type)0x0 &&
           seen[(long)(int)stone_num - (long)evp->stone_base_num] == '\0') &&
         (p_Var5->local_id != -1)) {
        if (stone_num == to_stone) {
          p_Var3 = p_Var5->last_remote_source;
          if (p_Var3 != (CMConnection_conflict)0x0) {
            *(undefined4 *)(cb + 0x10) = 1;
            *(uint *)(cb + 0x14) = stone_num;
            *(CMConnection_conflict *)(cb + 0x18) = p_Var3;
            backpressure_set_one(cm,(source_info *)cb);
          }
        }
        else {
          if ((long)p_Var5->output_count < 1) {
            iVar9 = 0;
            iVar7 = 0;
          }
          else {
            lVar6 = 0;
            iVar7 = 0;
            iVar9 = 0;
            do {
              uVar8 = (uint)(p_Var5->output_stone_ids[lVar6] == to_stone);
              iVar9 = iVar9 + uVar8;
              iVar7 = iVar7 + uVar8;
              lVar6 = lVar6 + 1;
            } while (p_Var5->output_count != lVar6);
          }
          if (0 < p_Var5->proto_action_count) {
            iVar1 = p_Var5->is_stalled;
            lVar6 = 0x28;
            lVar10 = 0;
            do {
              p_Var4 = p_Var5->proto_actions;
              iVar2 = *(int *)((long)p_Var4 + lVar6 + -0x28);
              if (iVar2 == 4) {
                if (*(int *)((long)&p_Var4->action_type + lVar6) == to_stone) {
                  iVar9 = iVar9 + 1;
                  iVar7 = iVar7 + 1;
                }
              }
              else if (iVar2 == 10) {
                iVar9 = iVar9 + (uint)(*(int *)((long)p_Var4 + lVar6 + -0x10) == to_stone);
              }
              if (iVar9 != 0) {
                *(undefined4 *)(cb + 0x10) = 0;
                *(uint *)(cb + 0x14) = stone_num;
                *(int *)(cb + 0x18) = (int)lVar10;
                *(int *)(cb + 0x1c) = iVar7;
                backpressure_set_one(cm,(source_info *)cb);
              }
              if ((iVar1 == 0) && (iVar7 != 0)) {
                seen[(long)(int)stone_num - (long)evp->stone_base_num] = '\x01';
                foreach_source_inner(cm,stone_num,seen,cb,(source_info *)(ulong)stone_num);
                seen[(long)(int)stone_num - (long)evp->stone_base_num] = '\0';
              }
              lVar10 = lVar10 + 1;
              lVar6 = lVar6 + 0x60;
            } while (lVar10 < p_Var5->proto_action_count);
          }
        }
      }
      stone_num = stone_num + 1;
    } while ((int)stone_num < evp->stone_base_num + evp->stone_count);
  }
  return;
}

Assistant:

static void
foreach_source_inner(CManager cm, EVstone to_stone, char *seen,
        ForeachSourceCB cb, struct source_info *info) {
    event_path_data evp = cm->evp;
    EVstone cur_stone;
    for (cur_stone = evp->stone_base_num; cur_stone < evp->stone_count + evp->stone_base_num; ++cur_stone) {
        EVaction cur_action;
        stone_type stone = stone_struct(evp, cur_stone);
        if (seen[cur_stone - evp->stone_base_num]) continue;
	if (!stone) continue;
        if (stone->local_id == -1) continue;
        if (cur_stone == to_stone) {
            if (stone->last_remote_source != NULL) {
                info->type = SOURCE_REMOTE;
                info->stone = cur_stone;
                info->u.remote.conn = stone->last_remote_source;
                cb(cm, info);
            }
        } else {
            int was_stalled = stone->is_stalled;
	    int i;
	    int matches = 0;
	    int matches_recursive = 0;
	    for (i = 0; i < stone->output_count; ++i) {
		if (to_stone == stone->output_stone_ids[i]) {
		    ++matches;
		    ++matches_recursive;
		}
	    }
            for (cur_action = 0; cur_action < stone->proto_action_count; ++cur_action) {
                proto_action *act;
                act = &stone->proto_actions[cur_action];
                switch (act->action_type) {
                case Action_Store:
                    if (act->o.store.target_stone_id == to_stone) {
                        ++matches;
                    }
                    break;
                case Action_Split:
                    break;
                case Action_Filter:
                    if (to_stone == act->o.term.target_stone_id) {
                        ++matches;
                        ++matches_recursive;
                    }
                    break;
                case Action_Immediate:
                    break;
                case Action_Terminal:
                    /* nothing to do */
                    break;
                default: ;
                    /* printf("source searching: unhandled type %d\n", act->action_type); */
                    /* TODO unhandled cases
                            - Source handles?
                     */
                }
                if (matches) {
                    info->type = SOURCE_ACTION;
                    info->stone = cur_stone;
                    info->u.action.action = cur_action;
                    info->u.action.would_recurse = matches_recursive;
                    cb(cm, info);
                }
                /* If a stone is stalled, conceptually no traffic is going to it.
                 * Note that the only way we should be trying to recurse through
                 * a stalled stone is if it were manually stalled.
                 */
                if (!was_stalled && matches_recursive) {
                    /* avoid infinite recursion */
                    seen[cur_stone - evp->stone_base_num] = 1;
                    foreach_source_inner(cm, cur_stone, seen, cb, info);
                    seen[cur_stone - evp->stone_base_num] = 0; /* XXX */
                }
            }
        }
    }
}